

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O3

CheckerSymbol * slang::ast::CheckerSymbol::fromSyntax(Scope *scope,CheckerDeclarationSyntax *syntax)

{
  undefined1 *puVar1;
  SyntaxKind SVar2;
  Compilation *args;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar3;
  DeclaredType *pDVar4;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  int iVar5;
  ArgumentDirection AVar6;
  undefined4 extraout_var;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar7;
  Diagnostic *diag;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  ulong uVar8;
  SyntaxNode *this;
  long lVar9;
  SourceRange SVar10;
  AssertionPortSymbol *port;
  SmallVector<const_slang::ast::AssertionPortSymbol_*,_5UL> ports;
  AssertionPortSymbol *local_b8;
  CheckerSymbol *local_b0;
  Compilation *local_a8;
  Type *local_a0;
  Scope *local_98;
  AssertionItemPortListSyntax *local_90;
  SourceLocation local_88;
  string_view local_80;
  SmallVectorBase<const_slang::ast::AssertionPortSymbol_*> local_70 [2];
  
  local_80._M_str = (char *)local_80._M_len;
  args = scope->compilation;
  local_70[0]._0_16_ = (undefined1  [16])parsing::Token::valueText(&syntax->name);
  local_80._M_len = (size_t)parsing::Token::location(&syntax->name);
  local_a8 = args;
  local_b0 = BumpAllocator::
             emplace<slang::ast::CheckerSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                       (&args->super_BumpAllocator,args,
                        (basic_string_view<char,_std::char_traits<char>_> *)local_70,
                        (SourceLocation *)&local_80);
  (local_b0->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
  syntax_00._M_ptr =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
  syntax_00._M_extent._M_extent_value =
       (syntax->super_MemberSyntax).attributes.
       super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
       _M_extent_value;
  Symbol::setAttributes(&local_b0->super_Symbol,scope,syntax_00);
  local_70[0].len = 0;
  local_70[0].data_ = (pointer)((long)local_70 + 0x18);
  local_70[0].cap = 5;
  src = extraout_RDX;
  if (syntax->portList != (AssertionItemPortListSyntax *)0x0) {
    local_a0 = Compilation::getType(local_a8,Untyped);
    local_90 = syntax->portList;
    uVar8 = (local_90->ports).elements._M_extent._M_extent_value + 1;
    src = extraout_RDX_00;
    if (1 < uVar8) {
      uVar8 = uVar8 >> 1;
      local_98 = &local_b0->super_Scope;
      lVar9 = 0;
      this = (SyntaxNode *)0x0;
      AVar6 = In;
      do {
        ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                            ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                             ((long)&(((local_90->ports).elements._M_ptr)->super_ConstTokenOrSyntax)
                                     .
                                     super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     .
                                     super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                             + lVar9));
        pSVar3 = *ppSVar7;
        if (pSVar3->previewNode != (SyntaxNode *)0x0) {
          Scope::addMembers(local_98,pSVar3->previewNode);
        }
        local_80 = parsing::Token::valueText((Token *)(pSVar3 + 5));
        local_88 = parsing::Token::location((Token *)(pSVar3 + 5));
        local_b8 = BumpAllocator::
                   emplace<slang::ast::AssertionPortSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
                             (&local_a8->super_BumpAllocator,&local_80,&local_88);
        (local_b8->super_Symbol).originatingSyntax = pSVar3;
        Symbol::setAttributes
                  (&local_b8->super_Symbol,scope,
                   *(span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
                     *)&pSVar3[2].previewNode);
        if (pSVar3[7].previewNode != (SyntaxNode *)0x0) {
          DeclaredType::setDimensionSyntax
                    (&local_b8->declaredType,
                     (SyntaxList<slang::syntax::VariableDimensionSyntax> *)&pSVar3[5].previewNode);
        }
        if (pSVar3[3].previewNode != (SyntaxNode *)0x0) {
          SVar10 = parsing::Token::range((Token *)&pSVar3[3].parent);
          Scope::addDiag(scope,(DiagCode)0x18000a,SVar10);
        }
        if (pSVar3[4].parent != (SyntaxNode *)0x0) {
          AVar6 = SemanticFacts::getDirection((TokenKind)pSVar3[4].kind);
          this = (SyntaxNode *)0x0;
        }
        (local_b8->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::ArgumentDirection> =
             (_Optional_payload_base<slang::ast::ArgumentDirection>)((ulong)AVar6 | 0x100000000);
        pDVar4 = (DeclaredType *)pSVar3[4].previewNode;
        if (((*(SyntaxKind *)&pDVar4->parent == ImplicitType) &&
            (pDVar4->initializer == (Expression *)0x0)) &&
           (pDVar4[1].dimensions == (SyntaxList<slang::syntax::VariableDimensionSyntax> *)0x0)) {
          if (this == (SyntaxNode *)0x0) {
            (local_b8->declaredType).type = local_a0;
            if (pSVar3[7].previewNode != (SyntaxNode *)0x0) {
              SVar10 = slang::syntax::SyntaxNode::sourceRange(pSVar3 + 6);
              diag = Scope::addDiag(scope,(DiagCode)0xb0009,SVar10);
              ast::operator<<(diag,local_a0);
            }
            if (pSVar3[4].parent != (SyntaxNode *)0x0) {
              SVar10 = parsing::Token::range((Token *)(pSVar3 + 4));
              Scope::addDiag(scope,(DiagCode)0x170006,SVar10);
            }
            this = (SyntaxNode *)0x0;
          }
          else {
            (local_b8->declaredType).typeOrLink.typeSyntax = (DataTypeSyntax *)this;
            puVar1 = &(local_b8->declaredType).field_0x3f;
            *puVar1 = *puVar1 & 0x7f;
          }
        }
        else {
          (local_b8->declaredType).typeOrLink.link = pDVar4;
          puVar1 = &(local_b8->declaredType).field_0x3f;
          *puVar1 = *puVar1 & 0x7f;
          this = pSVar3[4].previewNode;
          if ((((local_b8->direction).
                super__Optional_base<slang::ast::ArgumentDirection,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::ArgumentDirection>._M_engaged == true) &&
              (AVar6 == Out)) &&
             ((SVar2 = this->kind, SVar2 == PropertyType ||
              ((SVar2 == Untyped || (SVar2 == SequenceType)))))) {
            SVar10 = slang::syntax::SyntaxNode::sourceRange(this);
            Scope::addDiag(scope,(DiagCode)0x150006,SVar10);
            (local_b8->declaredType).type = local_a8->errorType;
          }
        }
        AVar6 = (local_b8->direction).
                super__Optional_base<slang::ast::ArgumentDirection,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::ArgumentDirection>._M_payload._M_value;
        if (*(long *)(pSVar3 + 8) != 0) {
          local_b8->defaultValueSyntax = *(PropertyExprSyntax **)(*(long *)(pSVar3 + 8) + 0x28);
        }
        Scope::insertMember(local_98,&local_b8->super_Symbol,(local_b0->super_Scope).lastMember,
                            false,true);
        SmallVectorBase<slang::ast::AssertionPortSymbol_const*>::
        emplace_back<slang::ast::AssertionPortSymbol_const*const&>
                  ((SmallVectorBase<slang::ast::AssertionPortSymbol_const*> *)local_70,&local_b8);
        lVar9 = lVar9 + 0x30;
        uVar8 = uVar8 - 1;
        src = extraout_RDX_02;
      } while (uVar8 != 0);
    }
  }
  iVar5 = SmallVectorBase<const_slang::ast::AssertionPortSymbol_*>::copy
                    (local_70,(EVP_PKEY_CTX *)local_a8,src);
  (local_b0->ports)._M_ptr = (pointer)CONCAT44(extraout_var,iVar5);
  (local_b0->ports)._M_extent._M_extent_value = extraout_RDX_01;
  if (local_70[0].data_ != (pointer)((long)local_70 + 0x18U)) {
    operator_delete(local_70[0].data_);
  }
  return local_b0;
}

Assistant:

CheckerSymbol& CheckerSymbol::fromSyntax(const Scope& scope,
                                         const CheckerDeclarationSyntax& syntax) {
    auto& comp = scope.getCompilation();
    auto result = comp.emplace<CheckerSymbol>(comp, syntax.name.valueText(),
                                              syntax.name.location());
    result->setSyntax(syntax);
    result->setAttributes(scope, syntax.attributes);

    SmallVector<const AssertionPortSymbol*> ports;
    if (syntax.portList) {
        // Checker port symbols differ enough in their rules that we
        // don't try to reuse buildPorts here.
        auto& untyped = comp.getType(SyntaxKind::Untyped);
        const DataTypeSyntax* lastType = nullptr;
        ArgumentDirection lastDir = ArgumentDirection::In;

        for (auto item : syntax.portList->ports) {
            if (item->previewNode)
                result->addMembers(*item->previewNode);

            auto port = comp.emplace<AssertionPortSymbol>(item->name.valueText(),
                                                          item->name.location());
            port->setSyntax(*item);
            port->setAttributes(scope, item->attributes);

            if (!item->dimensions.empty())
                port->declaredType.setDimensionSyntax(item->dimensions);

            if (item->local)
                scope.addDiag(diag::LocalNotAllowed, item->local.range());

            if (item->direction) {
                port->direction = SemanticFacts::getDirection(item->direction.kind);

                // If we have a direction we can never inherit the previous type.
                lastType = nullptr;
            }
            else {
                port->direction = lastDir;
            }

            if (isEmptyType(*item->type)) {
                if (lastType)
                    port->declaredType.setTypeSyntax(*lastType);
                else {
                    port->declaredType.setType(untyped);
                    if (!item->dimensions.empty()) {
                        scope.addDiag(diag::InvalidArrayElemType, item->dimensions.sourceRange())
                            << untyped;
                    }

                    if (item->direction)
                        scope.addDiag(diag::CheckerPortDirectionType, item->direction.range());
                }
            }
            else {
                port->declaredType.setTypeSyntax(*item->type);
                lastType = item->type;

                auto itemKind = item->type->kind;
                if (port->direction == ArgumentDirection::Out &&
                    (itemKind == SyntaxKind::PropertyType || itemKind == SyntaxKind::SequenceType ||
                     itemKind == SyntaxKind::Untyped)) {
                    scope.addDiag(diag::CheckerOutputBadType, item->type->sourceRange());
                    port->declaredType.setType(comp.getErrorType());
                }
            }

            lastDir = *port->direction;
            if (item->defaultValue)
                port->defaultValueSyntax = item->defaultValue->expr;

            result->addMember(*port);
            ports.push_back(port);
        }
    }
    result->ports = ports.copy(comp);

    return *result;
}